

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createSphereShape(btCollisionWorldImporter *this,btScalar radius)

{
  btCollisionShape *this_00;
  btCollisionShape *local_18;
  
  this_00 = (btCollisionShape *)btSphereShape::operator_new(0x48);
  btSphereShape::btSphereShape((btSphereShape *)this_00,radius);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back(&this->m_allocatedCollisionShapes,&local_18);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createSphereShape(btScalar radius)
{
	btSphereShape* shape = new btSphereShape(radius);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}